

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_data_reader.cpp
# Opt level: O2

void __thiscall
duckdb::TableDataReader::TableDataReader
          (TableDataReader *this,MetadataReader *reader,BoundCreateTableInfo *info)

{
  pointer __p;
  pointer pCVar1;
  unsigned_long local_20;
  pointer local_18;
  
  this->reader = reader;
  this->info = info;
  pCVar1 = unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>::operator->
                     (&info->base);
  local_20 = (long)(*(long *)((long)&pCVar1[1].catalog.field_2 + 8) -
                   pCVar1[1].catalog.field_2._M_allocated_capacity) / 0xd8;
  make_uniq<duckdb::PersistentTableData,unsigned_long>((duckdb *)&local_18,&local_20);
  __p = local_18;
  local_18 = (pointer)0x0;
  ::std::
  __uniq_ptr_impl<duckdb::PersistentTableData,_std::default_delete<duckdb::PersistentTableData>_>::
  reset((__uniq_ptr_impl<duckdb::PersistentTableData,_std::default_delete<duckdb::PersistentTableData>_>
         *)&info->data,__p);
  ::std::unique_ptr<duckdb::PersistentTableData,_std::default_delete<duckdb::PersistentTableData>_>
  ::~unique_ptr((unique_ptr<duckdb::PersistentTableData,_std::default_delete<duckdb::PersistentTableData>_>
                 *)&local_18);
  return;
}

Assistant:

TableDataReader::TableDataReader(MetadataReader &reader, BoundCreateTableInfo &info) : reader(reader), info(info) {
	info.data = make_uniq<PersistentTableData>(info.Base().columns.LogicalColumnCount());
}